

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::LRNParameter::set_engine(LRNParameter *this,LRNParameter_Engine value)

{
  if (value < (LRNParameter_Engine_CUDNN|LRNParameter_Engine_CAFFE)) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    this->engine_ = value;
    return;
  }
  __assert_fail("::caffe::LRNParameter_Engine_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x4fe2,"void caffe::LRNParameter::set_engine(::caffe::LRNParameter_Engine)");
}

Assistant:

bool LRNParameter_Engine_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}